

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2e991::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody
          (BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test *this)

{
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar2;
  undefined8 uVar3;
  char *pcVar4;
  BuildValue *pBVar5;
  reference pSVar6;
  char *in_R9;
  StringRef SVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f08;
  string local_ea8;
  AssertHelper local_e88;
  Message local_e80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e20;
  bool local_e11;
  undefined1 local_e10 [8];
  AssertionResult gtest_ar__8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  AssertHelper local_dc8;
  Message local_dc0;
  undefined1 local_db8 [8];
  AssertionResult gtest_ar__7;
  char *local_da0;
  StringRef staleFile_1;
  iterator __end1;
  iterator __begin1;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range1;
  bool hasLinkFileList;
  Message local_d38;
  unsigned_long local_d30;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_d28;
  size_type local_d10;
  undefined1 local_d08 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_cd8;
  Message local_cd0;
  bool local_cc1;
  undefined1 local_cc0 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_c90;
  Message local_c88;
  bool local_c79;
  undefined1 local_c78 [8];
  AssertionResult gtest_ar__5;
  undefined1 local_c48 [8];
  Optional<llbuild::buildsystem::BuildValue> result;
  AssertHelper local_bb0;
  Message local_ba8;
  undefined1 local_ba0 [8];
  AssertionResult gtest_ar__4;
  bool local_b79;
  undefined1 auStack_b78 [7];
  bool loadingResult;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_b68
  ;
  BuildSystem local_b60;
  BuildSystem system;
  MockBuildSystemDelegate delegate;
  undefined1 local_ac8 [8];
  raw_fd_ostream os_1;
  error_code ec_1;
  Message local_a60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a58;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a3c;
  allocator local_a3b;
  allocator local_a3a;
  allocator local_a39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  string asStack_a18 [32];
  string asStack_9f8 [32];
  iterator local_9d8;
  size_type local_9d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9c8;
  undefined1 local_9b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_980;
  Message local_978;
  undefined1 local_970 [8];
  AssertionResult gtest_ar__3;
  char *local_958;
  StringRef staleFile;
  iterator __end2;
  iterator __begin2;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *__range2;
  bool hasLinkFileList_1;
  Message local_8f0;
  unsigned_long local_8e8;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_8e0;
  size_type local_8c8;
  undefined1 local_8c0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_890;
  Message local_888;
  bool local_879;
  undefined1 local_878 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_848;
  Message local_840;
  bool local_831;
  undefined1 local_830 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_800 [8];
  Optional<llbuild::buildsystem::BuildValue> result_1;
  string local_780;
  AssertHelper local_760;
  Message local_758;
  undefined1 local_750 [8];
  AssertionResult gtest_ar_;
  bool local_729;
  undefined1 auStack_728 [7];
  bool loadingResult_1;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_718
  ;
  BuildSystem local_710;
  BuildSystem system_1;
  MockBuildSystemDelegate delegate_1;
  undefined1 local_680 [8];
  string linkFileList;
  Twine local_648;
  Twine local_630;
  Twine local_618;
  string local_600;
  StringRef local_5e0;
  undefined1 local_5d0 [8];
  SmallString<256U> builddb;
  undefined1 local_4b0 [8];
  BuildKey keyToBuild;
  undefined1 local_480 [8];
  raw_fd_ostream os;
  error_code ec;
  Twine local_408;
  Twine local_3f0;
  Twine local_3d8;
  string local_3c0;
  StringRef local_3a0;
  undefined1 local_390 [8];
  SmallString<256U> manifest;
  undefined1 local_270 [8];
  TmpDir tempDir;
  BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test *this_local;
  char *local_b8;
  char *local_b0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  char *local_88;
  char *local_80;
  char **local_78;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  char **local_60;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  char *local_38;
  int local_2c;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  char *local_18;
  int local_c;
  
  tempDir.tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = this;
  strlen("TestBody");
  llbuild::TmpDir::TmpDir((TmpDir *)local_270,stack0xfffffffffffffd80);
  llbuild::TmpDir::str_abi_cxx11_(&local_3c0,(TmpDir *)local_270);
  uVar3 = std::__cxx11::string::data();
  local_3a0.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_3a0.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_390,local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  llvm::Twine::Twine(&local_3d8,"manifest.llbuild");
  llvm::Twine::Twine(&local_3f0,"");
  llvm::Twine::Twine(&local_408,"");
  llvm::Twine::Twine((Twine *)&ec._M_cat,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_390,&local_3d8,&local_3f0,&local_408,(Twine *)&ec._M_cat
            );
  std::error_code::error_code((error_code *)&os.SupportsSeeking);
  join_0x00000010_0x00000000_ =
       llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_390);
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)local_480,join_0x00000010_0x00000000_,
             (error_code *)&os.SupportsSeeking,F_Text);
  bVar2 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x388,
                  "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                 );
  }
  llvm::raw_ostream::operator<<
            ((raw_ostream *)local_480,
             "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Hea..." /* TRUNCATED STRING LITERAL */
            );
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_480);
  builddb.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
       anon_var_dwarf_31436;
  pcVar4 = (char *)strlen("C.1");
  SVar7.Length = (size_t)pcVar4;
  SVar7.Data = pcVar4;
  llbuild::buildsystem::BuildKey::makeCommand
            ((BuildKey *)local_4b0,
             (BuildKey *)
             builddb.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
             _248_8_,SVar7);
  llbuild::TmpDir::str_abi_cxx11_(&local_600,(TmpDir *)local_270);
  uVar3 = std::__cxx11::string::data();
  local_5e0.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_5e0.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_5d0,local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  llvm::Twine::Twine(&local_618,"build.db");
  llvm::Twine::Twine(&local_630,"");
  llvm::Twine::Twine(&local_648,"");
  llvm::Twine::Twine((Twine *)((long)&linkFileList.field_2 + 8),"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_5d0,&local_618,&local_630,&local_648,
             (Twine *)((long)&linkFileList.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_680,
             "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList"
             ,(allocator *)&delegate_1.field_0x7f);
  std::allocator<char>::~allocator((allocator<char> *)&delegate_1.field_0x7f);
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&system_1,true);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&local_710,(BuildSystemDelegate *)&system_1,&local_718);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr(&local_718);
  pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_5d0);
  _auStack_728 = pcVar4;
  if (pcVar4 != (char *)0x0) {
    strlen(pcVar4);
  }
  llbuild::buildsystem::BuildSystem::attachDB(&local_710,_auStack_728,(string *)0x0);
  join_0x00000010_0x00000000_ =
       llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_390);
  local_729 = llbuild::buildsystem::BuildSystem::loadDescription
                        (&local_710,join_0x00000010_0x00000000_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_750,&local_729,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_750);
  if (!bVar2) {
    testing::Message::Message(&local_758);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_780,(internal *)local_750,(AssertionResult *)"loadingResult","false","true",
               in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_760,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x3a4,pcVar4);
    testing::internal::AssertHelper::operator=(&local_760,&local_758);
    testing::internal::AssertHelper::~AssertHelper(&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    testing::Message::~Message(&local_758);
  }
  result_1.Storage._117_3_ = 0;
  result_1.Storage._116_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_750);
  if (result_1.Storage._116_4_ == 0) {
    llbuild::buildsystem::BuildKey::BuildKey
              ((BuildKey *)&gtest_ar__1.message_,(BuildKey *)local_4b0);
    llbuild::buildsystem::BuildSystem::build
              ((Optional<llbuild::buildsystem::BuildValue> *)local_800,&local_710,
               (BuildKey *)&gtest_ar__1.message_);
    llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&gtest_ar__1.message_);
    local_831 = llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue
                          ((Optional<llbuild::buildsystem::BuildValue> *)local_800);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_830,&local_831,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
    if (!bVar2) {
      testing::Message::Message(&local_840);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_830,
                 (AssertionResult *)"result.hasValue()","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_848,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x3a8,pcVar4);
      testing::internal::AssertHelper::operator=(&local_848,&local_840);
      testing::internal::AssertHelper::~AssertHelper(&local_848);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_840);
    }
    result_1.Storage._117_3_ = 0;
    result_1.Storage._116_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
    if (result_1.Storage._116_4_ == 0) {
      pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                         ((Optional<llbuild::buildsystem::BuildValue> *)local_800);
      local_879 = llbuild::buildsystem::BuildValue::isStaleFileRemoval(pBVar5);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_878,&local_879,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
      if (!bVar2) {
        testing::Message::Message(&local_888);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_878,
                   (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9)
        ;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_890,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x3a9,pcVar4);
        testing::internal::AssertHelper::operator=(&local_890,&local_888);
        testing::internal::AssertHelper::~AssertHelper(&local_890);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_888);
      }
      result_1.Storage._117_3_ = 0;
      result_1.Storage._116_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_878);
      if (result_1.Storage._116_4_ == 0) {
        pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                           ((Optional<llbuild::buildsystem::BuildValue> *)local_800);
        llbuild::buildsystem::BuildValue::getStaleFileList(&local_8e0,pBVar5);
        local_8c8 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::size(&local_8e0)
        ;
        local_8e8 = 0x32;
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_8c0,"result.getValue().getStaleFileList().size()","50UL",
                   &local_8c8,&local_8e8);
        std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_8e0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8c0);
        if (!bVar2) {
          testing::Message::Message(&local_8f0);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_8c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xfffffffffffff708,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                     ,0x3aa,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xfffffffffffff708,&local_8f0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff708);
          testing::Message::~Message(&local_8f0);
        }
        result_1.Storage._117_3_ = 0;
        result_1.Storage._116_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_8c0);
        if (result_1.Storage._116_4_ == 0) {
          __range2._7_1_ = 0;
          pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                             ((Optional<llbuild::buildsystem::BuildValue> *)local_800);
          llbuild::buildsystem::BuildValue::getStaleFileList
                    ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin2,pBVar5);
          __end2 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                             ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin2
                             );
          staleFile.Length =
               (size_t)std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                                 ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                                  &__begin2);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2,(__normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                             *)&staleFile.Length), bVar2) {
            pSVar6 = __gnu_cxx::
                     __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                     ::operator*(&__end2);
            pcVar4 = pSVar6->Data;
            pcVar1 = (char *)pSVar6->Length;
            staleFile.Data = pcVar1;
            gtest_ar__3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )std::__cxx11::string::data();
            std::__cxx11::string::length();
            local_98._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            local_a8._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            local_70._M_head_impl =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 gtest_ar__3.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
            local_78 = &local_88;
            bVar2 = false;
            local_88 = pcVar4;
            local_80 = pcVar1;
            if (pcVar1 == local_958) {
              local_20.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )gtest_ar__3.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl;
              local_18 = pcVar4;
              if (local_958 == (char *)0x0) {
                local_c = 0;
              }
              else {
                local_c = memcmp(pcVar4,(void *)gtest_ar__3.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl,(size_t)local_958);
              }
              bVar2 = local_c == 0;
            }
            if (bVar2) {
              __range2._7_1_ = 1;
            }
            __gnu_cxx::
            __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
            ::operator++(&__end2);
          }
          result_1.Storage._116_4_ = 2;
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                    ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin2);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_970,(bool *)((long)&__range2 + 7),(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
          if (!bVar2) {
            testing::Message::Message(&local_978);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_970,
                       (AssertionResult *)"hasLinkFileList","false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_980,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x3b3,pcVar4);
            testing::internal::AssertHelper::operator=(&local_980,&local_978);
            testing::internal::AssertHelper::~AssertHelper(&local_980);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_978);
          }
          result_1.Storage._117_3_ = 0;
          result_1.Storage._116_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
          if (result_1.Storage._116_4_ == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_a38,"commandPreparing(C.1)",&local_a39);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(asStack_a18,"commandStarted(C.1)",&local_a3a);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(asStack_9f8,"commandFinished(C.1: 0)",&local_a3b);
            local_9d8 = &local_a38;
            local_9d0 = 3;
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::allocator(&local_a3c);
            __l._M_len = local_9d0;
            __l._M_array = local_9d8;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_9c8,__l,&local_a3c);
            llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                      (&local_a58,(MockBuildSystemDelegate *)&system_1);
            testing::internal::EqHelper::
            Compare<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                      ((EqHelper *)local_9b0,
                       "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandFinished(C.1: 0)\", })"
                       ,"delegate.getMessages()",&local_9c8,&local_a58);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_a58);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_9c8);
            std::
            allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~allocator(&local_a3c);
            local_f08 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_9d8;
            do {
              local_f08 = local_f08 + -1;
              std::__cxx11::string::~string((string *)local_f08);
            } while (local_f08 != &local_a38);
            std::allocator<char>::~allocator((allocator<char> *)&local_a3b);
            std::allocator<char>::~allocator((allocator<char> *)&local_a3a);
            std::allocator<char>::~allocator((allocator<char> *)&local_a39);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9b0);
            if (!bVar2) {
              testing::Message::Message(&local_a60);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_9b0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&ec_1._M_cat,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,0x3b9,pcVar4);
              testing::internal::AssertHelper::operator=((AssertHelper *)&ec_1._M_cat,&local_a60);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ec_1._M_cat);
              testing::Message::~Message(&local_a60);
            }
            result_1.Storage._117_3_ = 0;
            result_1.Storage._116_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_9b0);
            if (result_1.Storage._116_4_ == 0) {
              result_1.Storage._116_4_ = 0;
            }
          }
        }
      }
    }
    llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
              ((Optional<llbuild::buildsystem::BuildValue> *)local_800);
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem(&local_710);
  llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&system_1);
  if (result_1.Storage._116_4_ == 0) {
    std::error_code::error_code((error_code *)&os_1.SupportsSeeking);
    SVar7 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_390);
    llvm::raw_fd_ostream::raw_fd_ostream
              ((raw_fd_ostream *)local_ac8,SVar7,(error_code *)&os_1.SupportsSeeking,F_Text);
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)&os_1.SupportsSeeking);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!ec",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                    ,0x3bf,
                    "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                   );
    }
    llvm::raw_ostream::operator<<
              ((raw_ostream *)local_ac8,
               "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-targe..." /* TRUNCATED STRING LITERAL */
              );
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_ac8);
    llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system,true);
    llbuild::basic::createLocalFileSystem();
    llbuild::buildsystem::BuildSystem::BuildSystem
              (&local_b60,(BuildSystemDelegate *)&system,&local_b68);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr(&local_b68);
    pcVar4 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_5d0);
    _auStack_b78 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      strlen(pcVar4);
    }
    llbuild::buildsystem::BuildSystem::attachDB(&local_b60,_auStack_b78,(string *)0x0);
    join_0x00000010_0x00000000_ =
         llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_390);
    local_b79 = llbuild::buildsystem::BuildSystem::loadDescription
                          (&local_b60,join_0x00000010_0x00000000_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_ba0,&local_b79,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba0);
    if (!bVar2) {
      testing::Message::Message(&local_ba8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&result.Storage.hasVal,(internal *)local_ba0,
                 (AssertionResult *)"loadingResult","false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_bb0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x3d1,pcVar4);
      testing::internal::AssertHelper::operator=(&local_bb0,&local_ba8);
      testing::internal::AssertHelper::~AssertHelper(&local_bb0);
      std::__cxx11::string::~string((string *)&result.Storage.hasVal);
      testing::Message::~Message(&local_ba8);
    }
    result_1.Storage._117_3_ = 0;
    result_1.Storage._116_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba0);
    if (result_1.Storage._116_4_ == 0) {
      llbuild::buildsystem::BuildKey::BuildKey
                ((BuildKey *)&gtest_ar__5.message_,(BuildKey *)local_4b0);
      llbuild::buildsystem::BuildSystem::build
                ((Optional<llbuild::buildsystem::BuildValue> *)local_c48,&local_b60,
                 (BuildKey *)&gtest_ar__5.message_);
      llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&gtest_ar__5.message_);
      local_c79 = llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue
                            ((Optional<llbuild::buildsystem::BuildValue> *)local_c48);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_c78,&local_c79,(type *)0x0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c78);
      if (!bVar2) {
        testing::Message::Message(&local_c88);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__6.message_,(internal *)local_c78,
                   (AssertionResult *)"result.hasValue()","false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_c90,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x3d4,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
        testing::internal::AssertHelper::~AssertHelper(&local_c90);
        std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
        testing::Message::~Message(&local_c88);
      }
      result_1.Storage._117_3_ = 0;
      result_1.Storage._116_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c78);
      if (result_1.Storage._116_4_ == 0) {
        pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                           ((Optional<llbuild::buildsystem::BuildValue> *)local_c48);
        local_cc1 = llbuild::buildsystem::BuildValue::isStaleFileRemoval(pBVar5);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_cc0,&local_cc1,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_cc0);
        if (!bVar2) {
          testing::Message::Message(&local_cd0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_2.message_,(internal *)local_cc0,
                     (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",
                     in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_cd8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                     ,0x3d5,pcVar4);
          testing::internal::AssertHelper::operator=(&local_cd8,&local_cd0);
          testing::internal::AssertHelper::~AssertHelper(&local_cd8);
          std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_cd0);
        }
        result_1.Storage._117_3_ = 0;
        result_1.Storage._116_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_cc0);
        if (result_1.Storage._116_4_ == 0) {
          pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                             ((Optional<llbuild::buildsystem::BuildValue> *)local_c48);
          llbuild::buildsystem::BuildValue::getStaleFileList(&local_d28,pBVar5);
          local_d10 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::size
                                (&local_d28);
          local_d30 = 0x16;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_d08,"result.getValue().getStaleFileList().size()","22UL",
                     &local_d10,&local_d30);
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector(&local_d28);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d08);
          if (!bVar2) {
            testing::Message::Message(&local_d38);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d08);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xfffffffffffff2c0,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x3d6,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xfffffffffffff2c0,&local_d38);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff2c0)
            ;
            testing::Message::~Message(&local_d38);
          }
          result_1.Storage._117_3_ = 0;
          result_1.Storage._116_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_d08);
          if (result_1.Storage._116_4_ == 0) {
            __range1._7_1_ = 0;
            pBVar5 = llvm::Optional<llbuild::buildsystem::BuildValue>::getValue
                               ((Optional<llbuild::buildsystem::BuildValue> *)local_c48);
            llbuild::buildsystem::BuildValue::getStaleFileList
                      ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin1,pBVar5
                      );
            __end1 = std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::begin
                               ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                                &__begin1);
            staleFile_1.Length =
                 (size_t)std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::end
                                   ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)
                                    &__begin1);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end1,(__normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                                               *)&staleFile_1.Length), bVar2) {
              pSVar6 = __gnu_cxx::
                       __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
                       ::operator*(&__end1);
              pcVar4 = pSVar6->Data;
              pcVar1 = (char *)pSVar6->Length;
              staleFile_1.Data = pcVar1;
              gtest_ar__7.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )std::__cxx11::string::data();
              std::__cxx11::string::length();
              local_58._M_head_impl =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   gtest_ar__7.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
              local_60 = &local_b8;
              bVar2 = false;
              local_b8 = pcVar4;
              local_b0 = pcVar1;
              if (pcVar1 == local_da0) {
                local_40.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl =
                     (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )gtest_ar__7.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
                local_38 = pcVar4;
                if (local_da0 == (char *)0x0) {
                  local_2c = 0;
                }
                else {
                  local_2c = memcmp(pcVar4,(void *)gtest_ar__7.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,(size_t)local_da0);
                }
                bVar2 = local_2c == 0;
              }
              if (bVar2) {
                __range1._7_1_ = 1;
              }
              __gnu_cxx::
              __normal_iterator<llvm::StringRef_*,_std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>_>
              ::operator++(&__end1);
            }
            result_1.Storage._116_4_ = 4;
            std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~vector
                      ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&__begin1);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_db8,(bool *)((long)&__range1 + 7),(type *)0x0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db8);
            if (!bVar2) {
              testing::Message::Message(&local_dc0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)
                         &messages.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_db8,
                         (AssertionResult *)"hasLinkFileList","false","true",in_R9);
              pcVar4 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_dc8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,0x3df,pcVar4);
              testing::internal::AssertHelper::operator=(&local_dc8,&local_dc0);
              testing::internal::AssertHelper::~AssertHelper(&local_dc8);
              std::__cxx11::string::~string
                        ((string *)
                         &messages.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::Message::~Message(&local_dc0);
            }
            result_1.Storage._117_3_ = 0;
            result_1.Storage._116_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_db8);
            if (result_1.Storage._116_4_ == 0) {
              llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gtest_ar__8.message_,(MockBuildSystemDelegate *)&system);
              local_e28._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&gtest_ar__8.message_);
              local_e30._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gtest_ar__8.message_);
              std::operator+(&local_e70,"cannot remove stale file \'",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_680);
              std::operator+(&local_e50,&local_e70,"\': No such file or directory");
              local_e20 = std::
                          find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                    (local_e28,local_e30,&local_e50);
              local_e78._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gtest_ar__8.message_);
              bVar2 = __gnu_cxx::operator!=(&local_e20,&local_e78);
              local_e11 = (bool)((bVar2 ^ 0xffU) & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_e10,&local_e11,(type *)0x0);
              std::__cxx11::string::~string((string *)&local_e50);
              std::__cxx11::string::~string((string *)&local_e70);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e10);
              if (!bVar2) {
                testing::Message::Message(&local_e80);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_ea8,(internal *)local_e10,
                           (AssertionResult *)
                           "std::find(messages.begin(), messages.end(), \"cannot remove stale file \'\" + linkFileList + \"\': No such file or directory\") != messages.end()"
                           ,"true","false",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_e88,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                           ,0x3e3,pcVar4);
                testing::internal::AssertHelper::operator=(&local_e88,&local_e80);
                testing::internal::AssertHelper::~AssertHelper(&local_e88);
                std::__cxx11::string::~string((string *)&local_ea8);
                testing::Message::~Message(&local_e80);
              }
              result_1.Storage._117_3_ = 0;
              result_1.Storage._116_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_e10);
              if (result_1.Storage._116_4_ == 0) {
                result_1.Storage._116_4_ = 0;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_ar__8.message_);
            }
          }
        }
      }
      llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
                ((Optional<llbuild::buildsystem::BuildValue> *)local_c48);
    }
    llbuild::buildsystem::BuildSystem::~BuildSystem(&local_b60);
    llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system);
  }
  std::__cxx11::string::~string((string *)local_680);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_5d0);
  llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)local_4b0);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_390);
  llbuild::TmpDir::~TmpDir((TmpDir *)local_270);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemovalWithManyFiles) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Modules", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/module.modulemap"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  // We will check that the same file is present in both file lists, so it should not show up in the difference.
  std::string linkFileList = "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList";

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 50UL);

    // Check that `LinkFileList` is present in list of files of initial build
    bool hasLinkFileList = false;
    for (auto staleFile : result.getValue().getStaleFileList()) {
      if (staleFile == linkFileList) {
        hasLinkFileList = true;
      }
    }
    ASSERT_TRUE(hasLinkFileList);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, createLocalFileSystem());
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 22UL);

  // Check that `LinkFileList` is present in list of files of second build
  bool hasLinkFileList = false;
  for (auto staleFile : result.getValue().getStaleFileList()) {
    if (staleFile == linkFileList) {
      hasLinkFileList = true;
    }
  }
  ASSERT_TRUE(hasLinkFileList);

  // Check that `LinkFileList` is not present in the diff
  std::vector<std::string> messages = delegate.getMessages();
  ASSERT_FALSE(std::find(messages.begin(), messages.end(), "cannot remove stale file '" + linkFileList + "': No such file or directory") != messages.end());
}